

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,tcu::Vector<float,3>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_3>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  float fVar2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_3>_> *pVVar5;
  pointer pcVar6;
  Variable<float> *pVVar7;
  undefined7 uVar8;
  PrecisionCase *pPVar9;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_3>_>_>
  *pVVar10;
  undefined8 uVar11;
  FloatFormat *fmt;
  bool bVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  char *pcVar16;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  long lVar20;
  IVal *pIVar21;
  IVal *pIVar22;
  IVal *x;
  TestError *this_00;
  uint uVar23;
  TestLog *pTVar24;
  Vector<float,_3> *val;
  string *psVar25;
  IVal IVar26;
  byte bVar27;
  double dVar28;
  double dVar29;
  IVal in1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_3>_>_> outputs;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_518;
  pointer local_510;
  undefined1 local_508 [12];
  undefined4 uStack_4fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_3>_>_>
  *local_4e8;
  size_t local_4e0;
  Statement *local_4d8;
  ulong local_4d0;
  undefined1 local_4c8 [12];
  uint uStack_4bc;
  undefined1 local_4b8 [24];
  double local_4a0;
  string local_480;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_460;
  IVal local_458;
  ResultCollector *local_440;
  undefined1 local_438 [8];
  undefined1 auStack_430 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  double local_418;
  Data local_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  pointer local_290;
  FloatFormat *local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_280;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_3>_>_> local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar27 = 0;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4e0 = ((long)pVVar4 - (long)pVVar3 >> 2) * -0x5555555555555555;
  local_4e8 = variables;
  local_4d8 = stmt;
  local_460 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_3>_>_>::Outputs
            (&local_250,local_4e0);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"Statement: ",0xb);
  (*local_4d8->_vptr_Statement[2])(local_4d8,(ostringstream *)auStack_430);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_518 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_4c8 + 8);
  stack0xfffffffffffffb40 = (double)((ulong)uStack_4bc << 0x20);
  local_4b8._0_8_ = (_Base_ptr)0x0;
  local_4a0 = 0.0;
  local_4b8._8_8_ = p_Var1;
  local_4b8._16_8_ = p_Var1;
  (*local_4d8->_vptr_Statement[4])(local_4d8,local_4c8);
  if ((_Rb_tree_node_base *)local_4b8._8_8_ != p_Var1) {
    p_Var15 = (_Rb_tree_node_base *)local_4b8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_1a8);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var1);
  }
  pPVar9 = local_518;
  if (local_4a0 != 0.0) {
    local_438 = (undefined1  [8])((local_518->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,(char *)local_508._0_8_,CONCAT44(uStack_4fc,local_508._8_4_));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._0_8_ != &local_4f8) {
      operator_delete((void *)local_508._0_8_,local_4f8._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  pcVar16 = glu::getPrecisionName((pPVar9->m_ctx).precision);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)((long)&local_518 + (long)((TestLog *)((long)local_438 + -0x18))->m_log) +
                    0xe0);
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,pcVar16,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_518->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_518->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_518->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar24 = (TestLog *)(plVar18 + 2);
    if ((TestLog *)*plVar18 == pTVar24) {
      local_428._M_allocated_capacity = (size_type)pTVar24->m_log;
      local_428._8_8_ = plVar18[3];
      local_438 = (undefined1  [8])(auStack_430 + 8);
    }
    else {
      local_428._M_allocated_capacity = (size_type)pTVar24->m_log;
      local_438 = (undefined1  [8])*plVar18;
    }
    auStack_430 = (undefined1  [8])plVar18[1];
    *plVar18 = (long)pTVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_438);
    if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
      operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
    }
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_438,local_518,
             (local_4e8->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar11 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_438,local_518,
             (local_4e8->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar11 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  makeSymbol<float>((Symbol *)local_438,local_518,
                    (local_4e8->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*local_4d8->_vptr_Statement[2])(local_4d8,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar9 = local_518;
  pSVar19 = ShaderExecUtil::createExecutor
                      ((local_518->m_ctx).renderContext,(local_518->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_438 = (undefined1  [8])
              (local_460->in0).
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  auStack_430 = (undefined1  [8])
                (local_460->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_428._M_allocated_capacity =
       (size_type)
       (local_460->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._8_8_ =
       (local_460->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 != '\0') {
    (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
    (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,local_4e0,local_438,local_1a8);
    (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
    pVVar10 = local_4e8;
    lVar20 = 0x10;
    do {
      *(undefined1 *)((long)&local_458.m_hi + lVar20) = 0;
      *(undefined8 *)((long)&local_440 + lVar20) = 0x7ff0000000000000;
      *(undefined8 *)(local_438 + lVar20) = 0xfff0000000000000;
      lVar20 = lVar20 + 0x18;
    } while (lVar20 != 0x58);
    lVar20 = 0x10;
    do {
      *(undefined1 *)((long)&local_458.m_hi + lVar20) = 0;
      *(undefined8 *)((long)&local_440 + lVar20) = 0x7ff0000000000000;
      *(undefined8 *)(local_438 + lVar20) = 0xfff0000000000000;
      lVar20 = lVar20 + 0x18;
    } while (lVar20 != 0x58);
    local_4c8._0_8_ = local_4c8._0_8_ & 0xffffffffffffff00;
    stack0xfffffffffffffb40 = INFINITY;
    local_4b8._0_8_ = (_Base_ptr)0xfff0000000000000;
    lVar20 = 0x10;
    do {
      local_1b8._M_local_buf[lVar20] = '\0';
      *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
      *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
      lVar20 = lVar20 + 0x18;
    } while (lVar20 != 0x58);
    lVar20 = 0x10;
    do {
      local_1b8._M_local_buf[lVar20] = '\0';
      *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
      *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
      lVar20 = lVar20 + 0x18;
    } while (lVar20 != 0x58);
    local_510 = pVVar4;
    Environment::bind<tcu::Vector<float,3>>
              ((Environment *)&local_280,
               (local_4e8->in0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
               .m_ptr,(IVal *)local_438);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_280,
               (pVVar10->in1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)local_508);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_280,
               (pVVar10->in2).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_480);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_280,
               (pVVar10->in3).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_458);
    Environment::bind<float>
              ((Environment *)&local_280,
               (pVVar10->out0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_4c8);
    Environment::bind<tcu::Vector<float,3>>
              ((Environment *)&local_280,
               (pVVar10->out1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
               .m_ptr,(IVal *)local_1a8);
    if (local_510 == pVVar3) {
      local_4d0 = 0;
    }
    else {
      local_440 = &local_518->m_status;
      local_290 = (pointer)(local_4e0 + (local_4e0 == 0));
      local_510 = (pointer)0x0;
      local_4d0 = 0;
      local_288 = &(pPVar9->m_ctx).floatFormat;
      do {
        fmt = local_288;
        local_458._0_8_ = local_458._0_8_ & 0xffffffffffffff00;
        local_458.m_lo = INFINITY;
        local_458.m_hi = -INFINITY;
        lVar20 = 0x10;
        do {
          local_1b8._M_local_buf[lVar20] = '\0';
          *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
          *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
          lVar20 = lVar20 + 0x18;
        } while (lVar20 != 0x58);
        lVar20 = 0x10;
        do {
          local_1b8._M_local_buf[lVar20] = '\0';
          *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
          *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
          lVar20 = lVar20 + 0x18;
        } while (lVar20 != 0x58);
        if (((ulong)local_510 & 0xfff) == 0) {
          tcu::TestContext::touchWatchdog((local_518->super_TestCase).super_TestNode.m_testCtx);
        }
        pVVar4 = local_510;
        pVVar3 = (local_460->in0).
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_508._8_4_ = pVVar3[(long)local_510].m_data[2];
        local_508._0_8_ = *(undefined8 *)pVVar3[(long)local_510].m_data;
        ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                  ((IVal *)local_4c8,fmt,(Vector<float,_3> *)local_508);
        pVVar10 = local_4e8;
        ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                  ((IVal *)local_438,fmt,(IVal *)local_4c8);
        pIVar21 = Environment::lookup<tcu::Vector<float,3>>
                            ((Environment *)&local_280,
                             (pVVar10->in0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                             .m_ptr);
        pIVar22 = (IVal *)local_438;
        for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
          uVar8 = *(undefined7 *)&pIVar22->m_data[0].field_0x1;
          pIVar21->m_data[0].m_hasNaN = pIVar22->m_data[0].m_hasNaN;
          *(undefined7 *)&pIVar21->m_data[0].field_0x1 = uVar8;
          pIVar22 = (IVal *)((long)pIVar22 + ((ulong)bVar27 * -2 + 1) * 8);
          pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
        }
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_280,
                   (pVVar10->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_280,
                   (pVVar10->in2).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_280,
                   (pVVar10->in3).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        local_410.basic.type = (local_518->m_ctx).precision;
        local_418 = fmt->m_maxValue;
        local_438 = *(undefined1 (*) [8])fmt;
        auStack_430 = *(undefined1 (*) [8])&fmt->m_fractionBits;
        local_428._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
        local_428._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
        local_400 = 0;
        local_410._8_8_ = &local_280;
        (*local_4d8->_vptr_Statement[3])(local_4d8,local_438);
        pIVar22 = Environment::lookup<tcu::Vector<float,3>>
                            ((Environment *)&local_280,
                             (pVVar10->out1).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                             .m_ptr);
        ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                  ((IVal *)local_438,&local_2b8,pIVar22);
        psVar25 = (string *)local_438;
        pIVar22 = (IVal *)local_1a8;
        for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
          *(pointer *)pIVar22->m_data = (psVar25->_M_dataplus)._M_p;
          psVar25 = (string *)((long)psVar25 + (ulong)bVar27 * -0x10 + 8);
          pIVar22 = (IVal *)((long)pIVar22 + ((ulong)bVar27 * -2 + 1) * 8);
        }
        bVar12 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                           ((IVal *)local_1a8,
                            local_250.out1.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)pVVar4);
        local_438 = (undefined1  [8])(auStack_430 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"Shader output 1 is outside acceptable range","");
        bVar12 = tcu::ResultCollector::check(local_440,bVar12,(string *)local_438);
        if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
          operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
        }
        x = Environment::lookup<float>
                      ((Environment *)&local_280,
                       (local_4e8->out0).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.
                       m_ptr);
        tcu::FloatFormat::convert((Interval *)local_438,&local_2b8,x);
        local_458.m_hi = (double)local_428._M_allocated_capacity;
        local_458._0_8_ = local_438;
        uVar11 = local_458._0_8_;
        local_458.m_lo = (double)auStack_430;
        fVar2 = local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[(long)local_510];
        dVar28 = (double)fVar2;
        dVar29 = dVar28;
        if (NAN(fVar2)) {
          dVar29 = INFINITY;
          dVar28 = -INFINITY;
        }
        IVar26 = (IVal)(dVar28 <= (double)local_428._M_allocated_capacity &&
                       (double)auStack_430 <= dVar29);
        if ((NAN(fVar2)) &&
           (dVar28 <= (double)local_428._M_allocated_capacity && (double)auStack_430 <= dVar29)) {
          local_458.m_hasNaN = local_438[0];
          IVar26 = (IVal)local_458.m_hasNaN;
        }
        local_438 = (undefined1  [8])(auStack_430 + 8);
        local_458._0_8_ = uVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"Shader output 0 is outside acceptable range","");
        bVar13 = tcu::ResultCollector::check(local_440,(bool)((byte)IVar26 & 1),(string *)local_438)
        ;
        if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
          operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
        }
        uVar23 = (int)local_4d0 + ((byte)~(bVar12 && bVar13) & 1);
        local_4d0 = (ulong)uVar23;
        if ((int)uVar23 < 0x65 && (!bVar12 || !bVar13)) {
          local_438 = (undefined1  [8])((local_518->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
          pcVar16 = "Failed";
          if (bVar12 && bVar13) {
            pcVar16 = "Passed";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,pcVar16,6);
          pVVar10 = local_4e8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
          pVVar5 = (pVVar10->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          val = (Vector<float,_3> *)local_4b8;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_4c8._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4c8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_4c8._0_8_,(long)stack0xfffffffffffffb40);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_508,(BuiltinPrecisionTests *)&local_2b8,
                     (FloatFormat *)
                     ((local_460->in0).
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)pVVar4),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_508._0_8_,
                     CONCAT44(uStack_4fc,local_508._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._0_8_ != &local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_4c8._0_8_ != (Vector<float,_3> *)local_4b8) {
            operator_delete((void *)local_4c8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4b8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
          pVVar7 = (pVVar10->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_4c8._0_8_ = local_4b8;
          pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4c8,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_4c8._0_8_,(long)stack0xfffffffffffffb40);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
          valueToString<float>
                    ((string *)local_508,&local_2b8,
                     local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)local_510);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_508._0_8_,
                     CONCAT44(uStack_4fc,local_508._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,"\tExpected range: ",0x11);
          intervalToString<float>(&local_480,&local_2b8,&local_458);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,local_480._M_dataplus._M_p,local_480._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._0_8_ != &local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_4c8._0_8_ != local_4b8) {
            operator_delete((void *)local_4c8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4b8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
          pVVar5 = (pVVar10->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pIVar22 = (IVal *)local_4b8;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_4c8._0_8_ = pIVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4c8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_4c8._0_8_,(long)stack0xfffffffffffffb40);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_508,(BuiltinPrecisionTests *)&local_2b8,
                     (FloatFormat *)
                     (local_250.out1.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)pVVar4),
                     (Vector<float,_3> *)pIVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_508._0_8_,
                     CONCAT44(uStack_4fc,local_508._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,3>>
                    (&local_480,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_1a8,pIVar22
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,local_480._M_dataplus._M_p,local_480._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._0_8_ != &local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._M_allocated_capacity + 1);
          }
          if ((IVal *)local_4c8._0_8_ != (IVal *)local_4b8) {
            operator_delete((void *)local_4c8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4b8._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
          std::ios_base::~ios_base(local_3c0);
        }
        local_510 = (pointer)((long)local_510->m_data + 1);
      } while (local_510 != local_290);
    }
    pPVar9 = local_518;
    iVar14 = (int)local_4d0;
    if (100 < iVar14) {
      local_438 = (undefined1  [8])((local_518->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)auStack_430,iVar14 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
      std::ios_base::~ios_base(local_3c0);
    }
    if (iVar14 == 0) {
      local_438 = (undefined1  [8])((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"All ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_430," inputs passed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_438 = (undefined1  [8])((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
      std::ostream::operator<<((ostringstream *)auStack_430,iVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_430," inputs failed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
    std::ios_base::~ios_base(local_3c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
    ::~_Rb_tree(&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_p != &local_1b8) {
      operator_delete(local_1c8._M_p,
                      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != &local_1d8) {
      operator_delete(local_1e8._M_p,
                      CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1)
      ;
    }
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
    if (local_250.out1.
        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.out1.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.out1.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.out1.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
             ,0x11d4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}